

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

void __thiscall
pbrt::BilinearPatch::BilinearPatch
          (BilinearPatch *this,BilinearPatchMesh *mesh,int meshIndex,int blpIndex)

{
  Point3f *pPVar1;
  Point3f *pPVar2;
  Point3f *pPVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar12;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  int *piVar22;
  Point3f *pPVar23;
  float fVar24;
  bool bVar25;
  long lVar26;
  undefined4 *puVar27;
  undefined4 *puVar28;
  long lVar29;
  undefined1 *puVar30;
  long in_FS_OFFSET;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM19 [16];
  Point3f p [4] [4];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x3b8) = *(long *)(in_FS_OFFSET + -0x3b8) + 0xc;
  lVar26 = (long)(blpIndex << 2);
  piVar22 = mesh->vertexIndices;
  pPVar23 = mesh->p;
  pPVar1 = pPVar23 + piVar22[lVar26];
  pPVar2 = pPVar23 + piVar22[lVar26 + 1];
  pPVar3 = pPVar23 + piVar22[lVar26 + 2];
  iVar21 = piVar22[lVar26 + 3];
  bVar25 = IsRectangle(this,mesh);
  if (bVar25) {
    uVar4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
    uVar13 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
    auVar42._4_4_ = uVar13;
    auVar42._0_4_ = uVar4;
    auVar42._8_8_ = 0;
    uVar5 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
    uVar14 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
    auVar45._4_4_ = uVar14;
    auVar45._0_4_ = uVar5;
    auVar45._8_8_ = 0;
    auVar34 = vsubps_avx(auVar42,auVar45);
    auVar43._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar43._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar43._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar43._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar34 = vhaddps_avx(auVar43,auVar43);
    fVar35 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z -
             (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
    fVar35 = auVar34._0_4_ + fVar35 * fVar35;
    if (fVar35 < 0.0) {
      fVar35 = sqrtf(fVar35);
    }
    else {
      auVar34 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar35 = auVar34._0_4_;
    }
    uVar10 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
    uVar19 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
    auVar37._4_4_ = uVar19;
    auVar37._0_4_ = uVar10;
    auVar37._8_8_ = 0;
    uVar11 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
    uVar20 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
    auVar44._4_4_ = uVar20;
    auVar44._0_4_ = uVar11;
    auVar44._8_8_ = 0;
    auVar34 = vsubps_avx(auVar37,auVar44);
    auVar38._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar38._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar38._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar38._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar34 = vhaddps_avx(auVar38,auVar38);
    fVar36 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z -
             (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
    fVar36 = auVar34._0_4_ + fVar36 * fVar36;
    if (fVar36 < 0.0) {
      fVar36 = sqrtf(fVar36);
    }
    else {
      auVar34 = vsqrtss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
      fVar36 = auVar34._0_4_;
    }
    this->area = fVar35 * fVar36;
  }
  else {
    local_78 = ZEXT1664(ZEXT816(0) << 0x40);
    puVar27 = (undefined4 *)(local_f8 + 8);
    local_b8 = local_78;
    local_f8 = local_78;
    fVar35 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z;
    fVar36 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
    fVar39 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z;
    uVar6 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
    uVar15 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
    auVar34._4_4_ = uVar15;
    auVar34._0_4_ = uVar6;
    auVar34._8_8_ = 0;
    uVar7 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
    uVar16 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
    auVar48._4_4_ = uVar16;
    auVar48._0_4_ = uVar7;
    auVar48._8_8_ = 0;
    uVar8 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
    uVar17 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
    uVar9 = pPVar23[iVar21].super_Tuple3<pbrt::Point3,_float>.x;
    uVar18 = pPVar23[iVar21].super_Tuple3<pbrt::Point3,_float>.y;
    fVar40 = pPVar23[iVar21].super_Tuple3<pbrt::Point3,_float>.z;
    lVar26 = 0;
    do {
      auVar54 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar26);
      auVar53._0_4_ = auVar54._0_4_ / 3.0;
      auVar53._4_12_ = auVar54._4_12_;
      fVar41 = 1.0 - auVar53._0_4_;
      auVar54._4_4_ = fVar41;
      auVar54._0_4_ = fVar41;
      auVar54._8_4_ = fVar41;
      auVar54._12_4_ = fVar41;
      lVar29 = 0;
      puVar28 = puVar27;
      do {
        auVar31 = vcvtsi2ss_avx512f(in_XMM19,(int)lVar29);
        auVar55._0_4_ = auVar31._0_4_ / 3.0;
        auVar55._4_12_ = auVar31._4_12_;
        fVar24 = 1.0 - auVar55._0_4_;
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar24),ZEXT416((uint)fVar35));
        auVar32 = vmulss_avx512f(auVar55,ZEXT416((uint)fVar36));
        auVar31 = vaddss_avx512f(auVar31,auVar32);
        auVar32 = vmulss_avx512f(ZEXT416((uint)fVar24),ZEXT416((uint)fVar39));
        auVar33 = vmulss_avx512f(auVar55,ZEXT416((uint)fVar40));
        auVar32 = vaddss_avx512f(auVar32,auVar33);
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar41),auVar31);
        auVar32 = vmulss_avx512f(auVar53,auVar32);
        auVar31 = vaddss_avx512f(auVar31,auVar32);
        auVar32._4_4_ = fVar24;
        auVar32._0_4_ = fVar24;
        auVar32._8_4_ = fVar24;
        auVar32._12_4_ = fVar24;
        auVar32 = vmulps_avx512vl(auVar32,auVar34);
        auVar33._4_4_ = auVar55._0_4_;
        auVar33._0_4_ = auVar55._0_4_;
        auVar33._8_4_ = auVar55._0_4_;
        auVar33._12_4_ = auVar55._0_4_;
        auVar33 = vmulps_avx512vl(auVar33,auVar48);
        auVar32 = vaddps_avx512vl(auVar32,auVar33);
        auVar32 = vmulps_avx512vl(auVar54,auVar32);
        auVar56._0_4_ = auVar53._0_4_ * (fVar24 * (float)uVar8 + auVar55._0_4_ * (float)uVar9);
        auVar56._4_4_ = auVar53._0_4_ * (fVar24 * (float)uVar17 + auVar55._0_4_ * (float)uVar18);
        auVar56._8_4_ = auVar53._0_4_ * (fVar24 * 0.0 + auVar55._0_4_ * 0.0);
        auVar56._12_4_ = auVar53._0_4_ * (fVar24 * 0.0 + auVar55._0_4_ * 0.0);
        auVar32 = vaddps_avx512vl(auVar32,auVar56);
        uVar12 = vmovlps_avx(auVar32);
        *(undefined8 *)(puVar28 + -2) = uVar12;
        *puVar28 = auVar31._0_4_;
        lVar29 = lVar29 + 1;
        puVar28 = puVar28 + 3;
      } while (lVar29 != 4);
      lVar26 = lVar26 + 1;
      puVar27 = puVar27 + 0xc;
    } while (lVar26 != 4);
    this->area = 0.0;
    puVar30 = local_b8;
    lVar26 = 0;
    auVar52 = ZEXT1664(_DAT_003f9c60);
    do {
      lVar26 = lVar26 + 1;
      lVar29 = 0;
      do {
        fVar36 = *(float *)(puVar30 + lVar29 + -4) - *(float *)(puVar30 + lVar29 + -0x40);
        fVar35 = *(float *)(puVar30 + lVar29 + -8) - *(float *)(puVar30 + lVar29 + -0x2c);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(puVar30 + lVar29 + -0x34);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(puVar30 + lVar29 + -0x10);
        auVar48 = vsubps_avx(auVar49,auVar47);
        auVar31 = vpermt2ps_avx512vl(auVar48,auVar52._0_16_,ZEXT416((uint)fVar35));
        auVar53 = vfnmadd213ss_fma(ZEXT416((uint)fVar35),ZEXT416((uint)fVar36),
                                   ZEXT416((uint)(fVar36 * fVar35)));
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(puVar30 + lVar29);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(puVar30 + lVar29 + -0x3c);
        auVar54 = vsubps_avx(auVar50,auVar51);
        auVar34 = vmovshdup_avx(auVar54);
        auVar34 = vfmsub213ss_fma(auVar34,auVar48,ZEXT416((uint)(fVar36 * fVar35)));
        fVar35 = auVar34._0_4_ + auVar53._0_4_;
        auVar46._0_4_ = auVar54._0_4_ * auVar48._0_4_;
        auVar46._4_4_ = auVar54._4_4_ * auVar48._4_4_;
        auVar46._8_4_ = auVar54._8_4_ * auVar48._8_4_;
        auVar46._12_4_ = auVar54._12_4_ * auVar48._12_4_;
        auVar48 = vfnmadd213ps_fma(auVar48,auVar54,auVar46);
        auVar34 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),ZEXT416((uint)fVar36));
        auVar34 = vfmsub213ps_fma(auVar31,auVar34,auVar46);
        fVar36 = auVar48._0_4_ + auVar34._0_4_;
        fVar39 = auVar48._4_4_ + auVar34._4_4_;
        fVar40 = auVar48._8_4_ + auVar34._8_4_;
        fVar41 = auVar48._12_4_ + auVar34._12_4_;
        auVar31._0_4_ = fVar36 * fVar36;
        auVar31._4_4_ = fVar39 * fVar39;
        auVar31._8_4_ = fVar40 * fVar40;
        auVar31._12_4_ = fVar41 * fVar41;
        auVar34 = vmovshdup_avx(auVar31);
        fVar35 = auVar31._0_4_ + auVar34._0_4_ + fVar35 * fVar35;
        if (fVar35 < 0.0) {
          auVar52._0_4_ = sqrtf(fVar35);
          auVar52._4_60_ = extraout_var;
          auVar34 = auVar52._0_16_;
          auVar52 = ZEXT1664(_DAT_003f9c60);
        }
        else {
          auVar34 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
        }
        auVar34 = vfmadd213ss_fma(auVar34,SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)this->area));
        this->area = auVar34._0_4_;
        lVar29 = lVar29 + 0xc;
      } while (lVar29 != 0x24);
      puVar30 = puVar30 + 0x30;
    } while (lVar26 != 3);
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(const BilinearPatchMesh *mesh, int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];
    if (IsRectangle(mesh))
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}